

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_walls_draw.cpp
# Opt level: O1

void __thiscall GLWall::MakeVertices(GLWall *this,bool nosplit)

{
  FFlatVertex *pFVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  side_t *psVar7;
  FFlatVertexBuffer *pFVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  FFlatVertex *ptr;
  FFlatVertex *local_20;
  
  if (this->vertcount != 0) {
    return;
  }
  if (((!gl_seamless.Value || nosplit) || (psVar7 = this->seg->sidedef, psVar7 == (side_t *)0x0)) ||
     ((psVar7->Flags & 0x40) != 0)) {
    bVar11 = false;
  }
  else {
    bVar11 = (this->flags & 0x40) == 0;
  }
  local_20 = GLRenderer->mVBO->map;
  uVar9 = (ulong)GLRenderer->mVBO->mCurIndex;
  pFVar1 = local_20 + uVar9;
  fVar2 = this->zbottom[0];
  fVar3 = (this->glseg).y1;
  fVar4 = this->tcs[0].u;
  fVar5 = this->tcs[0].v;
  pFVar1->x = (this->glseg).x1;
  pFVar1->z = fVar2;
  pFVar1->y = fVar3;
  pFVar1->u = fVar4;
  pFVar1->v = fVar5;
  local_20 = local_20 + uVar9 + 1;
  if ((bVar11) && ((this->glseg).fracleft == 0.0)) {
    SplitLeftEdge(this,&local_20);
  }
  fVar2 = this->ztop[0];
  fVar3 = (this->glseg).y1;
  fVar4 = this->tcs[1].u;
  fVar5 = this->tcs[1].v;
  local_20->x = (this->glseg).x1;
  local_20->z = fVar2;
  local_20->y = fVar3;
  local_20->u = fVar4;
  local_20->v = fVar5;
  local_20 = local_20 + 1;
  if ((bVar11) && ((this->flags & 0x10) == 0)) {
    SplitUpperEdge(this,&local_20);
  }
  fVar2 = this->ztop[1];
  fVar3 = (this->glseg).y2;
  fVar4 = this->tcs[2].u;
  fVar5 = this->tcs[2].v;
  local_20->x = (this->glseg).x2;
  local_20->z = fVar2;
  local_20->y = fVar3;
  local_20->u = fVar4;
  local_20->v = fVar5;
  local_20 = local_20 + 1;
  if ((bool)((this->glseg).fracright == 1.0 & bVar11)) {
    SplitRightEdge(this,&local_20);
  }
  fVar2 = this->zbottom[1];
  fVar3 = (this->glseg).y2;
  fVar4 = this->tcs[3].u;
  fVar5 = this->tcs[3].v;
  local_20->x = (this->glseg).x2;
  local_20->z = fVar2;
  local_20->y = fVar3;
  local_20->u = fVar4;
  local_20->v = fVar5;
  local_20 = local_20 + 1;
  if ((bVar11) && ((this->flags & 0x20) == 0)) {
    SplitLowerEdge(this,&local_20);
  }
  pFVar8 = GLRenderer->mVBO;
  uVar10 = (int)((ulong)((long)local_20 - (long)pFVar8->map) >> 2) * -0x33333333;
  uVar6 = pFVar8->mCurIndex;
  this->vertindex = uVar6;
  pFVar8->mCurIndex = uVar10;
  if (0x1e828b < uVar10) {
    pFVar8->mCurIndex = pFVar8->mIndex;
  }
  this->vertcount = uVar10 - uVar6;
  return;
}

Assistant:

void GLWall::MakeVertices(bool nosplit)
{
	if (vertcount == 0)
	{
		bool split = (gl_seamless && !nosplit && seg->sidedef != NULL && !(seg->sidedef->Flags & WALLF_POLYOBJ) && !(flags & GLWF_NOSPLIT));

		FFlatVertex *ptr = GLRenderer->mVBO->GetBuffer();

		ptr->Set(glseg.x1, zbottom[0], glseg.y1, tcs[LOLFT].u, tcs[LOLFT].v);
		ptr++;
		if (split && glseg.fracleft == 0) SplitLeftEdge(ptr);
		ptr->Set(glseg.x1, ztop[0], glseg.y1, tcs[UPLFT].u, tcs[UPLFT].v);
		ptr++;
		if (split && !(flags & GLWF_NOSPLITUPPER)) SplitUpperEdge(ptr);
		ptr->Set(glseg.x2, ztop[1], glseg.y2, tcs[UPRGT].u, tcs[UPRGT].v);
		ptr++;
		if (split && glseg.fracright == 1) SplitRightEdge(ptr);
		ptr->Set(glseg.x2, zbottom[1], glseg.y2, tcs[LORGT].u, tcs[LORGT].v);
		ptr++;
		if (split && !(flags & GLWF_NOSPLITLOWER)) SplitLowerEdge(ptr);
		vertcount = GLRenderer->mVBO->GetCount(ptr, &vertindex);
	}
}